

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O1

void __thiscall
license::License::License(License *this,string *licenseName,string *project_folder,bool base64)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  int iVar6;
  logic_error *this_00;
  long *plVar7;
  size_type *psVar8;
  path normalized;
  path rproject_path;
  string rproject_path_str;
  path local_120;
  path local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string *local_c0;
  path local_b8;
  path local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  path local_50;
  
  this->_vptr_License = (_func_int **)&PTR__License_0054eb20;
  (this->m_private_key)._M_dataplus._M_p = (pointer)&(this->m_private_key).field_2;
  (this->m_private_key)._M_string_length = 0;
  (this->m_private_key).field_2._M_local_buf[0] = '\0';
  local_c0 = (string *)&this->m_feature_names;
  local_78 = &(this->m_feature_names).field_2;
  (this->m_feature_names)._M_dataplus._M_p = (pointer)local_78;
  (this->m_feature_names)._M_string_length = 0;
  (this->m_feature_names).field_2._M_local_buf[0] = '\0';
  this->m_base64 = base64;
  this->m_license_fname = licenseName;
  local_100.m_pathname._M_dataplus._M_p = (pointer)&local_100.m_pathname.field_2;
  pcVar5 = (project_folder->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar5,pcVar5 + project_folder->_M_string_length);
  boost::filesystem::detail::status((detail *)&local_120,&local_100,(error_code *)0x0);
  if ((1 < (uint)local_120.m_pathname._M_dataplus._M_p) &&
     (boost::filesystem::detail::status((detail *)&local_120,&local_100,(error_code *)0x0),
     (uint)local_120.m_pathname._M_dataplus._M_p == 3)) {
    paVar2 = &local_120.m_pathname.field_2;
    local_120.m_pathname._M_string_length = 0;
    local_120.m_pathname.field_2._M_allocated_capacity =
         local_120.m_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_120.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_100.m_pathname._M_dataplus._M_p,
               local_100.m_pathname._M_dataplus._M_p + local_100.m_pathname._M_string_length);
    iVar6 = std::__cxx11::string::compare((char *)&local_100);
    if (iVar6 == 0) {
      boost::filesystem::detail::current_path((detail *)local_70,(error_code *)0x0);
      std::__cxx11::string::operator=((string *)&local_120,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      boost::filesystem::detail::current_path((detail *)&local_98,(error_code *)0x0);
      boost::filesystem::path::operator/=(&local_98,&local_100);
      paVar3 = &local_b8.m_pathname.field_2;
      paVar4 = &local_98.m_pathname.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.m_pathname._M_dataplus._M_p == paVar4) {
        local_b8.m_pathname.field_2._8_8_ = local_98.m_pathname.field_2._8_8_;
        local_b8.m_pathname._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_b8.m_pathname._M_dataplus._M_p = local_98.m_pathname._M_dataplus._M_p;
      }
      local_b8.m_pathname._M_string_length = local_98.m_pathname._M_string_length;
      local_98.m_pathname._M_string_length = 0;
      local_98.m_pathname.field_2._M_local_buf[0] = '\0';
      local_98.m_pathname._M_dataplus._M_p = (pointer)paVar4;
      boost::filesystem::detail::current_path((detail *)&local_50,(error_code *)0x0);
      boost::filesystem::detail::canonical((detail *)local_70,&local_b8,&local_50,(error_code *)0x0)
      ;
      std::__cxx11::string::operator=((string *)&local_120,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.m_pathname._M_dataplus._M_p != &local_50.m_pathname.field_2) {
        operator_delete(local_50.m_pathname._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.m_pathname._M_dataplus._M_p != paVar3) {
        operator_delete(local_b8.m_pathname._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.m_pathname._M_dataplus._M_p != paVar4) {
        operator_delete(local_98.m_pathname._M_dataplus._M_p);
      }
    }
    else {
      boost::filesystem::detail::current_path((detail *)&local_b8,(error_code *)0x0);
      boost::filesystem::detail::canonical
                ((detail *)local_70,&local_100,&local_b8,(error_code *)0x0);
      std::__cxx11::string::operator=((string *)&local_120,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.m_pathname._M_dataplus._M_p != &local_b8.m_pathname.field_2) {
        operator_delete(local_b8.m_pathname._M_dataplus._M_p);
      }
    }
    (this->m_project_folder)._M_dataplus._M_p = (pointer)&(this->m_project_folder).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->m_project_folder,local_120.m_pathname._M_dataplus._M_p,
               local_120.m_pathname._M_dataplus._M_p + local_120.m_pathname._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_120.m_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.m_pathname._M_dataplus._M_p != &local_100.m_pathname.field_2) {
      operator_delete(local_100.m_pathname._M_dataplus._M_p);
    }
    p_Var1 = &(this->values_map)._M_t._M_impl.super__Rb_tree_header;
    (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_100.m_pathname._M_dataplus._M_p = (pointer)&local_100.m_pathname.field_2;
    pcVar5 = (this->m_project_folder)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar5,pcVar5 + (this->m_project_folder)._M_string_length);
    boost::filesystem::path::filename();
    std::__cxx11::string::_M_assign(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_120.m_pathname._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"private_key.rsa","");
    local_120.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_100.m_pathname._M_dataplus._M_p,
               local_100.m_pathname._M_dataplus._M_p + local_100.m_pathname._M_string_length);
    boost::filesystem::path::operator/=(&local_120,(path *)&local_e0);
    std::__cxx11::string::_M_assign((string *)&this->m_private_key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_120.m_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.m_pathname._M_dataplus._M_p != &local_100.m_pathname.field_2) {
      operator_delete(local_100.m_pathname._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_e0,"Path ",project_folder);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_120.m_pathname._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_120.m_pathname._M_dataplus._M_p == psVar8) {
    local_120.m_pathname.field_2._M_allocated_capacity = *psVar8;
    local_120.m_pathname.field_2._8_8_ = plVar7[3];
    local_120.m_pathname._M_dataplus._M_p = (pointer)&local_120.m_pathname.field_2;
  }
  else {
    local_120.m_pathname.field_2._M_allocated_capacity = *psVar8;
  }
  local_120.m_pathname._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_120);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

License::License(const std::string *licenseName, const std::string &project_folder, bool base64)
	: m_base64(base64), m_license_fname(licenseName), m_project_folder(normalize_project_path(project_folder)) {
	fs::path proj_folder(m_project_folder);
	// default feature = project name
	m_feature_names = proj_folder.filename().string();
	m_private_key = (proj_folder / PRIVATE_KEY_FNAME).string();
}